

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc.c
# Opt level: O2

void sc_export(uint8_t *dst,limb_t *x)

{
  uint8_t *puVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  sc_t tmp;
  limb_t local_38 [5];
  
  puVar1 = dst + 0x20;
  sc_reduce(local_38,x);
  uVar4 = 0;
  iVar3 = 0;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    uVar4 = uVar4 | local_38[lVar2] << ((byte)iVar3 & 0x3f);
    iVar3 = iVar3 + 0x34;
    for (; (7 < iVar3 && (dst < puVar1)); dst = dst + 1) {
      *dst = (uint8_t)uVar4;
      iVar3 = iVar3 + -8;
      uVar4 = uVar4 >> 8;
    }
  }
  return;
}

Assistant:

void
sc_export(uint8_t dst[32], const sc_t x)
{
	const uint8_t *endp = dst+32;
	sc_t tmp;
	uint64_t foo;
	int fill, i;

	sc_reduce(tmp, x);

	for (i = 0, foo = 0, fill = 0; i < K; i++) {
		foo |= (uint64_t)tmp[i] << fill;
		for (fill += LB; fill >= 8 && dst < endp; fill -= 8, foo >>= 8)
			*dst++ = foo & 0xff;
	}
}